

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

Bool host_poll_events(Host *host)

{
  HostKeycode HVar1;
  int iVar2;
  Bool BVar3;
  SDL_GameController *pSVar4;
  _func_void_HostHookContext_ptr_HostKeycode *p_Var5;
  Bool BVar6;
  SDL_Event event;
  SDL_Event local_68;
  
  iVar2 = SDL_PollEvent(&local_68);
  if (iVar2 == 0) {
    BVar6 = TRUE;
  }
  else {
    BVar6 = TRUE;
    do {
      host_ui_event(host->ui,&local_68);
      if ((int)local_68._0_4_ < 0x653) {
        if (local_68.type - 0x300 < 2) {
          if (0x1ff < (ulong)local_68.key.keysym.scancode) {
            __assert_fail("scancode < SDL_NUM_SCANCODES",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c"
                          ,0x9a,"HostKeycode scancode_to_keycode(SDL_Scancode)");
          }
          HVar1 = *(HostKeycode *)
                   (&scancode_to_keycode_s_map + (ulong)local_68.key.keysym.scancode * 4);
          BVar3 = host_ui_capture_keyboard(host->ui);
          if (BVar3 == FALSE) {
            host->key_state[HVar1] = (uint)(local_68.type == 0x300);
          }
          if (local_68.type == 0x300) {
            p_Var5 = (host->init).hooks.key_down;
          }
          else {
            p_Var5 = (host->init).hooks.key_up;
          }
          if (p_Var5 != (_func_void_HostHookContext_ptr_HostKeycode *)0x0) {
            (*p_Var5)(&host->hook_ctx,HVar1);
          }
        }
        else if (local_68.type == 0x100) {
          BVar6 = FALSE;
        }
      }
      else if (local_68.type == 0x653) {
        if (host->controller == (SDL_GameController *)0x0) {
          pSVar4 = (SDL_GameController *)SDL_GameControllerOpen(local_68.display.display);
          host->controller = pSVar4;
        }
      }
      else if ((local_68.type == 0x654) && (host->controller != (SDL_GameController *)0x0)) {
        SDL_GameControllerClose();
        host->controller = (SDL_GameController *)0x0;
      }
      iVar2 = SDL_PollEvent(&local_68);
    } while (iVar2 != 0);
  }
  return BVar6;
}

Assistant:

Bool host_poll_events(Host* host) {
  Emulator* e = host_get_emulator(host);
  Bool running = TRUE;
  SDL_Event event;
  while (SDL_PollEvent(&event)) {
    host_ui_event(host->ui, &event);

    switch (event.type) {
      case SDL_KEYDOWN:
      case SDL_KEYUP: {
        HostKeycode keycode = scancode_to_keycode(event.key.keysym.scancode);
        if (!host_ui_capture_keyboard(host->ui)) {
          host->key_state[keycode] = event.type == SDL_KEYDOWN;
        }
        if (event.type == SDL_KEYDOWN) {
          HOOK(key_down, keycode);
        } else {
          HOOK(key_up, keycode);
        }
        break;
      }
      case SDL_CONTROLLERDEVICEADDED:
        if (!host->controller) {
          host->controller = SDL_GameControllerOpen(event.cdevice.which);
        }
        break;
      case SDL_CONTROLLERDEVICEREMOVED: {
        if (host->controller) {
          SDL_GameControllerClose(host->controller);
          host->controller = NULL;
        }
        break;
      }
      case SDL_QUIT:
        running = FALSE;
        break;
      default: break;
    }
  }

  return running;
}